

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LargeHeapBlock.cpp
# Opt level: O1

void __thiscall
Memory::LargeHeapBlock::SweepObject<(Memory::SweepMode)0>
          (LargeHeapBlock *this,Recycler *recycler,LargeObjectHeader *header)

{
  undefined4 *puVar1;
  size_t sizeOfObject;
  code *pcVar2;
  bool bVar3;
  uchar uVar4;
  undefined8 *in_FS_OFFSET;
  
  if ((LargeObjectHeader *)(&this[1].super_HeapBlock._vptr_HeapBlock)[header->objectIndex] != header
     ) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar1 = (undefined4 *)*in_FS_OFFSET;
    *puVar1 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/LargeHeapBlock.cpp"
                       ,0x72f,"(this->HeaderList()[header->objectIndex] == header)",
                       "this->HeaderList()[header->objectIndex] == header");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar1 = 0;
  }
  uVar4 = LargeObjectHeader::GetAttributes(header,this->heapInfo->recycler->Cookie);
  if ((char)uVar4 < '\0') {
    return;
  }
  (&this[1].super_HeapBlock._vptr_HeapBlock)[header->objectIndex] = (_func_int **)0x0;
  sizeOfObject = header->objectSize;
  if ((this->bucket->supportFreeList == false) &&
     (bVar3 = TrimObject(this,recycler,header,sizeOfObject,false), bVar3)) {
    return;
  }
  FillFreeMemory(this,recycler,header,sizeOfObject + 0x20);
  return;
}

Assistant:

void
LargeHeapBlock::SweepObject<SweepMode_InThread>(Recycler * recycler, LargeObjectHeader * header)
{
    Assert(this->HeaderList()[header->objectIndex] == header);

    // Set the header and object to null only if this is not a finalizable object
    // If it's finalizable, it'll be zeroed out during dispose
    if ((header->GetAttributes(this->heapInfo->recycler->Cookie) & FinalizeBit) != FinalizeBit)
    {
        this->HeaderList()[header->objectIndex] = nullptr;

        size_t sizeOfObject = header->objectSize;

        bool objectTrimmed = false;

        if (!this->bucket->SupportFreeList())
        {
            objectTrimmed = TrimObject(recycler, header, sizeOfObject);
        }

        if (!objectTrimmed)
        {
            FillFreeMemory(recycler, header, sizeof(LargeObjectHeader) + sizeOfObject);
        }
    }
}